

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave-in.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pbVar1;
  double dVar2;
  char *pcVar3;
  typed_value<unsigned_long,_char> *ptVar4;
  const_iterator cVar5;
  ostream *poVar6;
  long *plVar7;
  undefined8 extraout_RDX;
  int iVar8;
  byte *pbVar9;
  complex<double> iq;
  char qq;
  char ii;
  size_t sample_rate;
  options_description desc;
  variables_map vm;
  demod_nrz wavein;
  byte local_4c2;
  byte local_4c1;
  double local_4c0;
  double local_4b8;
  size_t local_4b0;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  undefined1 *local_488 [2];
  undefined1 local_478 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_460 [24];
  void *local_448;
  undefined4 local_440;
  undefined8 local_438;
  undefined4 local_430;
  undefined8 local_428;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_420 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_408;
  undefined *local_3e0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_3d0 [8];
  _Rb_tree_node_base local_3c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_370;
  undefined1 local_340 [792];
  
  pbVar1 = (pointer)(local_340 + 0x10);
  local_340._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,"WavingZ - Wave-in options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_488,(string *)local_340,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_340._0_8_ != pbVar1) {
    operator_delete((void *)local_340._0_8_);
  }
  local_340._0_8_ = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_340,"help,h");
  ptVar4 = boost::program_options::value<unsigned_long>(&local_4b0);
  local_3e0[0] = (undefined *)0x1e8480;
  ptVar4 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar4,(unsigned_long *)local_3e0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"sample_rate,s",(char *)ptVar4);
  boost::program_options::options_description_easy_init::operator()(pcVar3,"unsigned,u");
  boost::program_options::variables_map::variables_map((variables_map *)local_3e0);
  local_408.super_function_base.vtable = (vtable_base *)0x0;
  local_408.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_408.super_function_base.functor._8_8_ = 0;
  local_408.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_340,argc,argv,(options_description *)local_488,0,
             &local_408);
  boost::program_options::store((basic_parsed_options *)local_340,(variables_map *)local_3e0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_340);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_408);
  boost::program_options::notify((variables_map *)local_3e0);
  local_340._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"help","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_3d0,(key_type *)local_340);
  if ((pointer)local_340._0_8_ != pbVar1) {
    operator_delete((void *)local_340._0_8_);
  }
  if (cVar5._M_node == &local_3c8) {
    local_340._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"unsigned","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_3d0,(key_type *)local_340);
    if ((pointer)local_340._0_8_ != pbVar1) {
      operator_delete((void *)local_340._0_8_);
    }
    local_4a8._M_unused._M_object = (void *)0x0;
    local_4a8._8_8_ = 0;
    local_490 = std::_Function_handler<void_(unsigned_char_*,_unsigned_char_*),_process_wavingz>::
                _M_invoke;
    local_498 = std::_Function_handler<void_(unsigned_char_*,_unsigned_char_*),_process_wavingz>::
                _M_manager;
    wavingz::demod::demod_nrz::demod_nrz
              ((demod_nrz *)local_340,local_4b0,
               (function<void_(unsigned_char_*,_unsigned_char_*)> *)&local_4a8);
    if (local_498 != (code *)0x0) {
      (*local_498)(&local_4a8,&local_4a8,__destroy_functor);
    }
    while( true ) {
      plVar7 = (long *)std::istream::get((char *)&std::cin);
      if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) break;
      pbVar9 = &local_4c2;
      plVar7 = (long *)std::istream::get((char *)&std::cin);
      if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) break;
      if (cVar5._M_node == &local_3c8) {
        local_4b8 = (double)(int)(char)local_4c1 / 127.0;
        local_4c0 = (double)(int)(char)local_4c2 / 127.0;
      }
      else {
        local_4b8 = (double)local_4c1 / 127.0 + -1.0;
        local_4c0 = (double)local_4c2 / 127.0 + -1.0;
      }
      dVar2 = cabs(local_4b8);
      if (1.0 < dVar2) {
        __assert_fail("std::abs(iq) <= 1.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/wave-in.cpp"
                      ,0x5d,"int main(int, char **)");
      }
      iq._M_value._8_8_ = extraout_RDX;
      iq._M_value._0_8_ = pbVar9;
      wavingz::demod::demod_nrz::operator()((demod_nrz *)local_340,iq);
    }
    wavingz::demod::demod_nrz::~demod_nrz((demod_nrz *)local_340);
    iVar8 = 0;
  }
  else {
    poVar6 = (ostream *)
             boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)local_488);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Examples:",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "   rtl_sdr -f 868420000 -s 2000000 -g 15 - | ./wave-in -s 2000000 -u",0x44);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   hackrf_transfer -f 868420000 -s 2000000 -r data.cs8",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   ./wave-in -s 2000000 -u < data.cs8",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    iVar8 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  local_3e0[0] = &std::length_error::typeinfo;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_370);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_3a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_3d0);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_420);
  if (local_448 != (void *)0x0) {
    operator_delete(local_448);
    local_448 = (void *)0x0;
    local_440 = 0;
    local_438 = 0;
    local_430 = 0;
    local_428 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_460);
  if (local_488[0] != local_478) {
    operator_delete(local_488[0]);
  }
  return iVar8;
}

Assistant:

int
main(int argc, char** argv)
{
    size_t sample_rate;

    po::options_description desc("WavingZ - Wave-in options");
    desc.add_options()
        ("help,h", "Produce this help message")
        ("sample_rate,s", po::value<size_t>(&sample_rate)->default_value(2000000), "Sample rate (default 2M)")
        ("unsigned,u", "Use unsigned8 (RTL-SDR) instead of signed8 (HackRF One)")
       ;

    po::variables_map vm;
    po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);

    if (vm.count("help")) {
        cout << desc << "\n";
        cout << "\n";
        cout << "Examples:" << "\n";
        cout << "\n";
        cout << "   rtl_sdr -f 868420000 -s 2000000 -g 15 - | ./wave-in -s 2000000 -u" << "\n";
        cout << "\n";
        cout << "   hackrf_transfer -f 868420000 -s 2000000 -r data.cs8" << "\n";
        cout << "   ./wave-in -s 2000000 -u < data.cs8" << "\n";
        cout << "\n";
        return 1;
    }

    bool unsigned_input = vm.count("unsigned");

    struct process_wavingz {
        void operator()(uint8_t* begin, uint8_t*end)
        {
            wavingz::zwave_print(std::cout, begin, end) << std::endl;
        }
    } wave_callback;

    wavingz::demod::demod_nrz wavein(sample_rate, wave_callback);

    for(;;) {
        std::complex<double> iq;
        char ii, qq;
        if(!cin.get(ii) || !cin.get(qq)) break;
        if (unsigned_input)
        {
            iq.real(double((uint8_t)ii)/127.0 - 1.0);
            iq.imag(double((uint8_t)qq) / 127.0 - 1.0);
        }
        else
        {
            iq.real(double(ii)/127.0);
            iq.imag(double(qq)/127.0);
        }
        assert(std::abs(iq) <= 1.0);
        wavein(iq);
    }
    return 0;
}